

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O2

Complex __thiscall libDAI::BP::logZ(BP *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t I;
  long lVar4;
  size_t i;
  ulong uVar5;
  double dVar6;
  undefined8 uVar7;
  undefined1 in_XMM3 [16];
  undefined1 auVar8 [16];
  double local_88 [2];
  double local_78 [2];
  Factor local_68;
  
  lVar4 = 8;
  uVar5 = 0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if (uVar3 <= uVar5) break;
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x70);
    uVar7 = 0x3ff0000000000000;
    auVar8 = vcvtusi2sd_avx512f(in_XMM3,*(long *)(lVar1 + lVar4) - *(long *)(lVar1 + -8 + lVar4) >>
                                        3);
    dVar6 = 1.0 - auVar8._0_8_;
    local_78[1] = 0.0;
    local_78[0] = dVar6;
    beliefV(&local_68,this,uVar5);
    TProb<double>::entropy(&local_68._p);
    local_88[0] = dVar6;
    local_88[1] = (double)uVar7;
    std::operator*((complex<double> *)local_78,(complex<double> *)local_88);
    TFactor<double>::~TFactor(&local_68);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x18;
  }
  uVar5 = 0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    auVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x48))
                       ((long *)CONCAT44(extraout_var_01,iVar2));
    if (auVar8._0_8_ <= uVar5) break;
    beliefF(&local_68,this,uVar5);
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    auVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x50))
                       ((long *)CONCAT44(extraout_var_02,iVar2),uVar5);
    KL_dist<double>((libDAI *)&local_68,auVar8._0_8_,auVar8._8_8_);
    TFactor<double>::~TFactor(&local_68);
    uVar5 = uVar5 + 1;
  }
  return (Complex)(_ComplexT)auVar8;
}

Assistant:

Complex BP::logZ() const {
        Complex sum = 0.0;
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
        return sum;
    }